

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::scroll(QWidget *this,int dx,int dy)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  QGraphicsProxyWidget *this_01;
  QRect *this_02;
  QRect *pQVar2;
  QRect *rect;
  long in_FS_OFFSET;
  QRect QVar3;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->data->widget_attributes;
  if (((((uVar1 >> 10 & 1) == 0) || (*(long *)(*(long *)&this->field_0x8 + 0x28) != 0)) &&
      (dy != 0 || dx != 0)) && ((uVar1 & 0x8000) != 0)) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    this_01 = (QGraphicsProxyWidget *)QWidgetPrivate::nearestGraphicsProxyWidget(this);
    if (this_01 == (QGraphicsProxyWidget *)0x0) {
      QWidgetPrivate::setDirtyOpaqueRegion(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidgetPrivate::scroll_sys(this_00,dx,dy);
        return;
      }
      goto LAB_003014b6;
    }
    this_02 = (QRect *)QRegion::begin();
    pQVar2 = (QRect *)QRegion::end();
    for (; this_02 != pQVar2; this_02 = this_02 + 1) {
      QVar3 = QRect::translated(this_02,dx,dy);
      local_58.xp = (qreal)QVar3.x1.m_i.m_i;
      local_58.yp = (qreal)QVar3.y1.m_i.m_i;
      local_58.w = (qreal)(((long)QVar3.x2.m_i.m_i - (long)QVar3.x1.m_i.m_i) + 1);
      local_58.h = (qreal)(((QVar3._8_8_ >> 0x20) - (QVar3._0_8_ >> 0x20)) + 1);
      QGraphicsItem::update((QGraphicsItem *)(this_01 + 0x10),&local_58);
    }
    QGraphicsProxyWidget::subWidgetRect(&local_58,this_01,this);
    QGraphicsItem::scroll((QGraphicsItem *)(this_01 + 0x10),(double)dx,(double)dy,&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003014b6:
  __stack_chk_fail();
}

Assistant:

void QWidget::scroll(int dx, int dy)
{
    if ((!updatesEnabled() && children().size() == 0) || !isVisible())
        return;
    if (dx == 0 && dy == 0)
        return;
    Q_D(QWidget);
#if QT_CONFIG(graphicsview)
    if (QGraphicsProxyWidget *proxy = QWidgetPrivate::nearestGraphicsProxyWidget(this)) {
        // Graphics View maintains its own dirty region as a list of rects;
        // until we can connect item updates directly to the view, we must
        // separately add a translated dirty region.
        for (const QRect &rect : d->dirty)
            proxy->update(rect.translated(dx, dy));
        proxy->scroll(dx, dy, proxy->subWidgetRect(this));
        return;
    }
#endif
    d->setDirtyOpaqueRegion();
    d->scroll_sys(dx, dy);
}